

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O0

void __thiscall Imath_2_5::Euler<float>::angleMapping(Euler<float> *this,int *i,int *j,int *k)

{
  int iVar1;
  int m [3];
  int *k_local;
  int *j_local;
  int *i_local;
  Euler<float> *this_local;
  
  m[(byte)this->field_0xc >> 3 & 3] = 0;
  iVar1 = 2;
  if (((byte)this->field_0xc >> 2 & 1) != 0) {
    iVar1 = 1;
  }
  m[(int)((((byte)this->field_0xc >> 3 & 3) + 1) % 3)] = iVar1;
  iVar1 = 1;
  if (((byte)this->field_0xc >> 2 & 1) != 0) {
    iVar1 = 2;
  }
  m[(int)((((byte)this->field_0xc >> 3 & 3) + 2) % 3)] = iVar1;
  *i = m[0];
  *j = m[1];
  *k = m[2];
  return;
}

Assistant:

inline void
 Euler<T>::angleMapping(int &i, int &j, int &k) const
{
    int m[3];

    m[_initialAxis] = 0;
    m[(_initialAxis+1) % 3] = _parityEven ? 1 : 2;
    m[(_initialAxis+2) % 3] = _parityEven ? 2 : 1;
    i = m[0];
    j = m[1];
    k = m[2];
}